

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont_conflict * __thiscall
ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig_conflict *font_cfg_template)

{
  char *compressed_ttf_data_base85;
  ImFont_conflict *pIVar1;
  ImWchar *local_c8;
  ImFont_conflict *font;
  ImWchar *glyph_ranges;
  char *ttf_compressed_base85;
  ImFontConfig_conflict font_cfg;
  ImFontConfig_conflict *font_cfg_template_local;
  ImFontAtlas_conflict *this_local;
  
  font_cfg.DstFont = (ImFont_conflict *)font_cfg_template;
  if (font_cfg_template == (ImFontConfig_conflict *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)&ttf_compressed_base85);
  }
  else {
    memcpy(&ttf_compressed_base85,font_cfg_template,0x88);
  }
  if (font_cfg.DstFont == (ImFont_conflict *)0x0) {
    font_cfg.SizePixels = 1.4013e-45;
    font_cfg.FontNo = 1;
    font_cfg.OversampleH._0_1_ = 1;
  }
  if ((float)font_cfg._12_4_ <= 0.0) {
    font_cfg.FontDataOwnedByAtlas = false;
    font_cfg._13_3_ = 0x415000;
  }
  if (font_cfg.FontBuilderFlags._2_1_ == '\0') {
    ImFormatString((char *)((long)&font_cfg.FontBuilderFlags + 2),0x28,"ProggyClean.ttf, %dpx",
                   (ulong)(uint)(int)(float)font_cfg._12_4_);
  }
  font_cfg.FontBuilderFlags._0_2_ = 0x85;
  font_cfg.GlyphExtraSpacing.y = (float)(int)((float)font_cfg._12_4_ / 13.0) * 1.0;
  compressed_ttf_data_base85 = GetDefaultCompressedFontDataTTFBase85();
  if (font_cfg._48_8_ == 0) {
    local_c8 = GetGlyphRangesDefault(this);
  }
  else {
    local_c8 = (ImWchar *)font_cfg._48_8_;
  }
  pIVar1 = AddFontFromMemoryCompressedBase85TTF
                     (this,compressed_ttf_data_base85,(float)font_cfg._12_4_,
                      (ImFontConfig_conflict *)&ttf_compressed_base85,local_c8);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 13.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "ProggyClean.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;
    font_cfg.GlyphOffset.y = 1.0f * IM_FLOOR(font_cfg.SizePixels / 13.0f);  // Add +1 offset per 13 units

    const char* ttf_compressed_base85 = GetDefaultCompressedFontDataTTFBase85();
    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedBase85TTF(ttf_compressed_base85, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    return font;
}